

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf,xmlAttributePtr attr)

{
  xmlAttributeDefault xVar1;
  char *pcVar2;
  int iVar3;
  
  xmlOutputBufferWrite(buf,10,"<!ATTLIST ");
  xmlOutputBufferWriteString(buf,(char *)attr->elem);
  xmlOutputBufferWrite(buf,1," ");
  if (attr->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)attr->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)attr->name);
  switch(attr->atype) {
  case XML_ATTRIBUTE_CDATA:
    pcVar2 = " CDATA";
    goto LAB_00173043;
  case XML_ATTRIBUTE_ID:
    pcVar2 = " ID";
    iVar3 = 3;
    break;
  case XML_ATTRIBUTE_IDREF:
    pcVar2 = " IDREF";
LAB_00173043:
    iVar3 = 6;
    break;
  case XML_ATTRIBUTE_IDREFS:
    pcVar2 = " IDREFS";
    goto LAB_00173054;
  case XML_ATTRIBUTE_ENTITY:
    pcVar2 = " ENTITY";
LAB_00173054:
    iVar3 = 7;
    break;
  case XML_ATTRIBUTE_ENTITIES:
    pcVar2 = " ENTITIES";
    goto LAB_0017307f;
  case XML_ATTRIBUTE_NMTOKEN:
    pcVar2 = " NMTOKEN";
    iVar3 = 8;
    break;
  case XML_ATTRIBUTE_NMTOKENS:
    pcVar2 = " NMTOKENS";
LAB_0017307f:
    iVar3 = 9;
    break;
  case XML_ATTRIBUTE_ENUMERATION:
    pcVar2 = " (";
    iVar3 = 2;
    goto LAB_00173137;
  case XML_ATTRIBUTE_NOTATION:
    pcVar2 = " NOTATION (";
    iVar3 = 0xb;
LAB_00173137:
    xmlOutputBufferWrite(buf,iVar3,pcVar2);
    xmlBufDumpEnumeration(buf,attr->tree);
  default:
    goto switchD_00173014_default;
  }
  xmlOutputBufferWrite(buf,iVar3,pcVar2);
switchD_00173014_default:
  xVar1 = attr->def;
  if (xVar1 == XML_ATTRIBUTE_FIXED) {
    pcVar2 = " #FIXED";
    iVar3 = 7;
  }
  else if (xVar1 == XML_ATTRIBUTE_IMPLIED) {
    pcVar2 = " #IMPLIED";
    iVar3 = 9;
  }
  else {
    if (xVar1 != XML_ATTRIBUTE_REQUIRED) goto LAB_001730e6;
    pcVar2 = " #REQUIRED";
    iVar3 = 10;
  }
  xmlOutputBufferWrite(buf,iVar3,pcVar2);
LAB_001730e6:
  if (attr->defaultValue != (xmlChar *)0x0) {
    xmlOutputBufferWrite(buf,1," ");
    xmlOutputBufferWriteQuotedString(buf,attr->defaultValue);
  }
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf, xmlAttributePtr attr) {
    xmlOutputBufferWrite(buf, 10, "<!ATTLIST ");
    xmlOutputBufferWriteString(buf, (const char *) attr->elem);
    xmlOutputBufferWrite(buf, 1, " ");
    if (attr->prefix != NULL) {
	xmlOutputBufferWriteString(buf, (const char *) attr->prefix);
	xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) attr->name);

    switch (attr->atype) {
	case XML_ATTRIBUTE_CDATA:
	    xmlOutputBufferWrite(buf, 6, " CDATA");
	    break;
	case XML_ATTRIBUTE_ID:
	    xmlOutputBufferWrite(buf, 3, " ID");
	    break;
	case XML_ATTRIBUTE_IDREF:
	    xmlOutputBufferWrite(buf, 6, " IDREF");
	    break;
	case XML_ATTRIBUTE_IDREFS:
	    xmlOutputBufferWrite(buf, 7, " IDREFS");
	    break;
	case XML_ATTRIBUTE_ENTITY:
	    xmlOutputBufferWrite(buf, 7, " ENTITY");
	    break;
	case XML_ATTRIBUTE_ENTITIES:
	    xmlOutputBufferWrite(buf, 9, " ENTITIES");
	    break;
	case XML_ATTRIBUTE_NMTOKEN:
	    xmlOutputBufferWrite(buf, 8, " NMTOKEN");
	    break;
	case XML_ATTRIBUTE_NMTOKENS:
	    xmlOutputBufferWrite(buf, 9, " NMTOKENS");
	    break;
	case XML_ATTRIBUTE_ENUMERATION:
	    xmlOutputBufferWrite(buf, 2, " (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	case XML_ATTRIBUTE_NOTATION:
	    xmlOutputBufferWrite(buf, 11, " NOTATION (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	default:
            /* assert(0); */
            break;
    }

    switch (attr->def) {
	case XML_ATTRIBUTE_NONE:
	    break;
	case XML_ATTRIBUTE_REQUIRED:
	    xmlOutputBufferWrite(buf, 10, " #REQUIRED");
	    break;
	case XML_ATTRIBUTE_IMPLIED:
	    xmlOutputBufferWrite(buf, 9, " #IMPLIED");
	    break;
	case XML_ATTRIBUTE_FIXED:
	    xmlOutputBufferWrite(buf, 7, " #FIXED");
	    break;
	default:
            /* assert(0); */
            break;
    }

    if (attr->defaultValue != NULL) {
	xmlOutputBufferWrite(buf, 1, " ");
	xmlOutputBufferWriteQuotedString(buf, attr->defaultValue);
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}